

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O0

h264_macroblock * h264_mb_nb(h264_slice *slice,h264_mb_pos pos,int inter)

{
  uint32_t *puVar1;
  int in_ESI;
  long in_RDI;
  h264_macroblock *mbt;
  h264_macroblock *mbp;
  int in_stack_ffffffffffffffd0;
  h264_mb_pos in_stack_ffffffffffffffd4;
  h264_slice *in_stack_ffffffffffffffd8;
  h264_macroblock *local_8;
  
  local_8 = h264_mb_nb_p(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                         in_stack_ffffffffffffffd0);
  puVar1 = (uint32_t *)(*(long *)(in_RDI + 0xc40) + (ulong)*(uint *)(in_RDI + 0xc34) * 0x3774);
  if (in_ESI != 0) {
    if (in_ESI == 1) {
      if ((((*(int *)(in_RDI + 0xc28) != 0) && (local_8->mb_type != 0x39)) &&
          ((*(uint *)(in_RDI + 0xc34) & 1) != 0)) && (local_8->mb_field_decoding_flag == *puVar1)) {
        local_8 = local_8 + 1;
      }
    }
    else {
      if (in_ESI != 2) {
        abort();
      }
      if (*(int *)(in_RDI + 0xc28) != 0) {
        if (*puVar1 == 0) {
          if ((*(uint *)(in_RDI + 0xc34) & 1) == 0) {
            if (local_8->mb_type != 0x39) {
              local_8 = local_8 + 1;
            }
          }
          else {
            local_8 = (h264_macroblock *)(puVar1 + -0xddd);
          }
        }
        else if ((local_8->mb_type != 0x39) &&
                (((*(uint *)(in_RDI + 0xc34) & 1) != 0 || (local_8->mb_field_decoding_flag == 0))))
        {
          local_8 = local_8 + 1;
        }
      }
    }
  }
  return local_8;
}

Assistant:

const struct h264_macroblock *h264_mb_nb(struct h264_slice *slice, enum h264_mb_pos pos, int inter) {
	const struct h264_macroblock *mbp = h264_mb_nb_p(slice, pos, inter);
	const struct h264_macroblock *mbt = &slice->mbs[slice->curr_mb_addr];
	switch (pos) {
		case H264_MB_THIS:
			return mbp;
		case H264_MB_A:
			/* to the left */
			/* if not MBAFF - simply use mbp */
			/* if MBAFF and mbp not available - just pass mbp */
			/* if MBAFF and mbp available and frame/field coding differs - use mbp[0] */
			/* if MBAFF and mbp available and frame/field coding same - use mbp[curr_mb & 1] */
			if (slice->mbaff_frame_flag
					&& mbp->mb_type != H264_MB_TYPE_UNAVAIL
					&& (slice->curr_mb_addr & 1)
					&& mbp->mb_field_decoding_flag == mbt->mb_field_decoding_flag)
				return mbp + 1;
			return mbp;
		case H264_MB_B:
			if (slice->mbaff_frame_flag) {
				if (mbt->mb_field_decoding_flag) {
					/* MBAFF and in field mb */
					if (mbp->mb_type == H264_MB_TYPE_UNAVAIL)
						return mbp;
					/* MBAFF and in field mb, with mb pair above available */
					/* if above mb pair is frame coded, use bottom mb */
					/* if above is field coded, use mb of same parity */
					if (!(slice->curr_mb_addr & 1)
							&& mbp->mb_field_decoding_flag)
						return mbp;
					else
						return mbp+1;
				} else {
					/* MBAFF and in frame mb */
					/* if in bottom mb of the pair, use the top mb */
					if (slice->curr_mb_addr & 1)
						return mbt-1;
					/* otherwise, use the bottom mb of the above pair, whether field or frame */
					else if (mbp->mb_type != H264_MB_TYPE_UNAVAIL)
						return mbp+1;
					else
						return mbp;
				}
			}
			return mbp;
		default:
			abort();
	}
}